

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O1

VPointF __thiscall
rlottie::internal::model::KeyFrames<VPointF,_void>::value
          (KeyFrames<VPointF,_void> *this,int frameNo)

{
  pointer pFVar1;
  pointer pFVar2;
  pointer this_00;
  bool bVar3;
  undefined8 in_XMM0_Qa;
  VPointF VVar4;
  
  VVar4.my = (float)((ulong)in_XMM0_Qa >> 0x20);
  VVar4.mx = (float)frameNo;
  this_00 = (this->frames_).
            super__Vector_base<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (VVar4.mx <= this_00->start_) {
    return (this_00->value_).start_;
  }
  pFVar1 = (this->frames_).
           super__Vector_base<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar1[-1].end_ <= VVar4.mx) {
    return pFVar1[-1].value_.end_;
  }
  bVar3 = this_00 == pFVar1;
  if (!bVar3) {
    if ((VVar4.mx < this_00->start_) || (this_00->end_ <= VVar4.mx)) {
      pFVar2 = this_00 + 1;
      do {
        this_00 = pFVar2;
        bVar3 = this_00 == pFVar1;
        if (bVar3) goto LAB_0012f042;
        pFVar2 = this_00 + 1;
      } while ((VVar4.mx < this_00->start_) || (this_00->end_ <= VVar4.mx));
    }
    VVar4 = Frame::value(this_00,frameNo);
  }
LAB_0012f042:
  if (bVar3) {
    VVar4.mx = 0.0;
    VVar4.my = 0.0;
  }
  return VVar4;
}

Assistant:

T value(int frameNo) const
    {
        if (frames_.front().start_ >= frameNo)
            return frames_.front().value_.start_;
        if (frames_.back().end_ <= frameNo) return frames_.back().value_.end_;

        for (const auto &keyFrame : frames_) {
            if (frameNo >= keyFrame.start_ && frameNo < keyFrame.end_)
                return keyFrame.value(frameNo);
        }
        return {};
    }